

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O0

int * __thiscall dynamicgraph::SignalPtr<double,_int>::getTime(SignalPtr<double,_int> *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  SignalBase<int> *pSVar4;
  undefined4 extraout_var;
  SignalPtr<double,_int> *this_local;
  
  uVar2 = (*this->_vptr_SignalPtr[6])();
  if (((uVar2 & 1) == 0) || (bVar1 = autoref(this), bVar1)) {
    this_local = (SignalPtr<double,_int> *)
                 SignalBase<int>::getTime
                           ((SignalBase<int> *)
                            ((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]));
  }
  else {
    pSVar4 = getAbstractPtr(this);
    iVar3 = (*pSVar4->_vptr_SignalBase[2])();
    this_local = (SignalPtr<double,_int> *)CONCAT44(extraout_var,iVar3);
  }
  return (int *)this_local;
}

Assistant:

const Time &SignalPtr<T, Time>::getTime() const {
  if ((isAbstractPluged()) && (!autoref())) {
    return getAbstractPtr()->getTime();
  }
  return Signal<T, Time>::getTime();
}